

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  TestPartResult *this;
  string *str;
  ostream *in_RDI;
  string message_1;
  string location_1;
  TestPartResult *part_1;
  int i_1;
  int skipped;
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kIndent;
  TestPartResult *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  TestResult *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int iVar4;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  TestPartResult *local_e0;
  int local_d8;
  int local_d4;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  TestPartResult *local_40;
  int local_38;
  int local_34;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffd68);
  local_34 = 0;
  for (local_38 = 0; iVar4 = local_38, iVar2 = TestResult::total_part_count((TestResult *)0x13739a),
      iVar4 < iVar2; local_38 = local_38 + 1) {
    local_40 = TestResult::GetTestPartResult
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
    ;
    bVar1 = TestPartResult::failed(in_stack_fffffffffffffd40);
    if (bVar1) {
      std::operator<<(local_8,",\n");
      local_34 = local_34 + 1;
      if (local_34 == 1) {
        poVar3 = std::operator<<(local_8,local_30);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"failures");
        std::operator<<(poVar3,"\": [\n");
      }
      TestPartResult::file_name(in_stack_fffffffffffffd40);
      TestPartResult::line_number(local_40);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      TestPartResult::message((TestPartResult *)0x137531);
      std::operator+(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
      EscapeJson(in_stack_fffffffffffffda8);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      poVar3 = std::operator<<(local_8,local_30);
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,local_30);
      poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
      poVar3 = std::operator<<(poVar3,local_90);
      poVar3 = std::operator<<(poVar3,"\",\n");
      poVar3 = std::operator<<(poVar3,local_30);
      poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
      poVar3 = std::operator<<(poVar3,local_30);
      std::operator<<(poVar3,"  }");
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
    }
  }
  if (0 < local_34) {
    poVar3 = std::operator<<(local_8,"\n");
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,"]");
  }
  local_d4 = 0;
  local_d8 = 0;
  while (iVar4 = local_d8, iVar2 = TestResult::total_part_count((TestResult *)0x13780a),
        iVar4 < iVar2) {
    this = TestResult::GetTestPartResult
                     (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_e0 = this;
    bVar1 = TestPartResult::skipped(this);
    iVar2 = (int)((ulong)this >> 0x20);
    if (bVar1) {
      std::operator<<(local_8,",\n");
      local_d4 = local_d4 + 1;
      if (local_d4 == 1) {
        poVar3 = std::operator<<(local_8,local_30);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"skipped");
        std::operator<<(poVar3,"\": [\n");
      }
      str = (string *)TestPartResult::file_name(in_stack_fffffffffffffd40);
      TestPartResult::line_number(local_e0);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((char *)CONCAT44(iVar4,in_stack_fffffffffffffdd8),iVar2);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      TestPartResult::message((TestPartResult *)0x137972);
      std::operator+(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
      EscapeJson(str);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      poVar3 = std::operator<<(local_8,local_30);
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,local_30);
      poVar3 = std::operator<<(poVar3,"    \"message\": \"");
      poVar3 = std::operator<<(poVar3,local_120);
      in_stack_fffffffffffffd68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar3,"\"\n");
      in_stack_fffffffffffffd60 = std::operator<<((ostream *)in_stack_fffffffffffffd68,local_30);
      std::operator<<(in_stack_fffffffffffffd60,"  }");
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
    }
    local_d8 = local_d8 + 1;
  }
  if (0 < local_d4) {
    poVar3 = std::operator<<(local_8,"\n");
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,"]");
  }
  poVar3 = std::operator<<(local_8,"\n");
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffd68);
  poVar3 = std::operator<<(poVar3,local_180);
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}